

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseFailureContainsCorrectDetails::RunImpl
          (TestCheckArray2DCloseFailureContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_9f0 [2];
  TestDetails local_9b0 [2];
  TestDetails local_970 [2];
  TestDetails local_930 [2];
  TestDetails local_8f0;
  float local_8cc;
  int local_8c8 [2];
  int data2 [2] [2];
  int data1 [2] [2];
  undefined1 local_8a0 [8];
  ScopedCurrentTest scopedResults;
  TestDetails testDetails;
  undefined1 local_860 [8];
  TestResults testResults;
  RecordingReporter reporter;
  int line;
  TestCheckArray2DCloseFailureContainsCorrectDetails *this_local;
  
  reporter._2092_4_ = 0;
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_860,(TestReporter *)&testResults.m_failureCount);
  UnitTest::TestDetails::TestDetails
            ((TestDetails *)&scopedResults.m_oldTestDetails,"array2DCloseTest","array2DCloseSuite",
             "filename",-1);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_8a0,(TestResults *)local_860,
             (TestDetails *)&scopedResults.m_oldTestDetails);
  data2[1][0] = 0;
  data2[1][1] = 1;
  local_8c8[0] = 0;
  local_8c8[1] = 1;
  data2[0][0] = 3;
  data2[0][1] = 3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8cc = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f0,*ppTVar3,0x2b1);
  UnitTest::CheckArray2DClose<int[2][2],int[2][2],float>
            (pTVar1,(int (*) [2] [2])(data2 + 1),(int (*) [2] [2])local_8c8,2,2,&local_8cc,
             &local_8f0);
  reporter._2092_4_ = 0x2b1;
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_8a0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_930,*ppTVar3,0x2b4);
  UnitTest::CheckEqual(pTVar1,"array2DCloseTest",reporter.lastFailedSuite + 0xf8,local_930);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_970,*ppTVar3,0x2b5);
  UnitTest::CheckEqual(pTVar1,"array2DCloseSuite",reporter.lastFailedFile + 0xfc,local_970);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_9b0,*ppTVar3,0x2b6);
  UnitTest::CheckEqual(pTVar1,"filename",reporter.lastStartedTest + 0xfc,local_9b0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_9f0,*ppTVar3,0x2b7);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&reporter.field_0x82c,(int *)(reporter.lastFailedFile + 0xf8),local_9f0);
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("array2DCloseTest", "array2DCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		int const data1[2][2] = { {0, 1}, {2, 3} };
        int const data2[2][2] = { {0, 1}, {3, 3} };
		CHECK_ARRAY2D_CLOSE (data1, data2, 2, 2, 0.01f);     line = __LINE__;
    }

    CHECK_EQUAL("array2DCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("array2DCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}